

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry-renderers.c
# Opt level: O1

void show_combined_generic
               (renderer_info *info,ui_entry_details *details,wchar_t vcombined,wchar_t acombined)

{
  long lVar1;
  ui_entry_details combined_details;
  wchar_t local_40;
  wchar_t local_3c;
  ui_entry_details local_38;
  
  local_40 = acombined;
  local_3c = vcombined;
  local_38.label_position = (loc)loc(0,0);
  local_38.value_position = details->combined_position;
  local_38.position_step = (loc)loc(0,0);
  local_38.combined_position = (loc)loc(0,0);
  local_38.vertical_label = false;
  local_38.alternate_color_first = false;
  local_38.known_rune = details->known_rune;
  local_38.show_combined = false;
  lVar1 = (long)info->combined_renderer_index;
  if ((0 < lVar1) && (info->combined_renderer_index <= renderer_count)) {
    if (renderers[lVar1 + -1].backend != (backend_info *)0x0) {
      (*(renderers[lVar1 + -1].backend)->func)
                ((wchar_t *)0x0,L'\0',&local_3c,&local_40,L'\x01',&local_38,renderers + lVar1 + -1);
    }
  }
  return;
}

Assistant:

static void show_combined_generic(const struct renderer_info *info,
	const struct ui_entry_details *details, int vcombined, int acombined)
{
	struct ui_entry_details combined_details;

	combined_details.label_position = loc(0, 0);
	combined_details.value_position = details->combined_position;
	combined_details.position_step = loc(0, 0);
	combined_details.combined_position = loc(0, 0);
	combined_details.vertical_label = false;
	combined_details.alternate_color_first = false;
	combined_details.known_rune = details->known_rune;
	combined_details.show_combined = false;
	ui_entry_renderer_apply(info->combined_renderer_index, NULL,
		0, &vcombined, &acombined, 1, &combined_details);
}